

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_literal(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int yythunkpos49;
  int yypos49;
  int yythunkpos48;
  int yypos48;
  int yythunkpos46;
  int yypos46;
  int yythunkpos45;
  int yypos45;
  int yythunkpos42;
  int yypos42;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar8 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yymatchClass(G,(uchar *)"","\'");
  if (iVar6 == 0) {
LAB_001054c9:
    G->pos = iVar8;
    G->thunkpos = iVar3;
    iVar8 = yymatchClass(G,(uchar *)"","\"");
    if (iVar8 != 0) {
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      do {
        iVar8 = G->pos;
        iVar3 = G->thunkpos;
        iVar6 = G->pos;
        iVar5 = G->thunkpos;
        iVar9 = yymatchClass(G,(uchar *)"","\"");
        if (iVar9 != 0) break;
        G->pos = iVar6;
        G->thunkpos = iVar5;
        iVar6 = yy_char(G);
      } while (iVar6 != 0);
      G->pos = iVar8;
      G->thunkpos = iVar3;
      yyText(G,G->begin,G->end);
      G->end = G->pos;
      iVar8 = yymatchClass(G,(uchar *)"","\"");
      if ((iVar8 != 0) && (iVar8 = yy__(G), iVar8 != 0)) goto LAB_0010560f;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar6 = G->pos;
      iVar5 = G->thunkpos;
      iVar9 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yymatchClass(G,(uchar *)"","\'");
      if (iVar7 != 0) break;
      G->pos = iVar9;
      G->thunkpos = iVar4;
      iVar9 = yy_char(G);
    } while (iVar9 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar5;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    iVar6 = yymatchClass(G,(uchar *)"","\'");
    if ((iVar6 == 0) || (iVar6 = yy__(G), iVar6 == 0)) goto LAB_001054c9;
LAB_0010560f:
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_literal(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "literal"));

  {  int yypos42= G->pos, yythunkpos42= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\200\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "'")) goto l43;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l43;
  l44:;	
  {  int yypos45= G->pos, yythunkpos45= G->thunkpos;
  {  int yypos46= G->pos, yythunkpos46= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\200\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "'")) goto l46;
  goto l45;
  l46:;	  G->pos= yypos46; G->thunkpos= yythunkpos46;
  }  if (!yy_char(G))  goto l45;
  goto l44;
  l45:;	  G->pos= yypos45; G->thunkpos= yythunkpos45;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l43;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\200\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "'")) goto l43;
  if (!yy__(G))  goto l43;
  goto l42;
  l43:;	  G->pos= yypos42; G->thunkpos= yythunkpos42;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\004\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "\"")) goto l41;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l41;
  l47:;	
  {  int yypos48= G->pos, yythunkpos48= G->thunkpos;
  {  int yypos49= G->pos, yythunkpos49= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\004\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "\"")) goto l49;
  goto l48;
  l49:;	  G->pos= yypos49; G->thunkpos= yythunkpos49;
  }  if (!yy_char(G))  goto l48;
  goto l47;
  l48:;	  G->pos= yypos48; G->thunkpos= yythunkpos48;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l41;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\004\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "\"")) goto l41;
  if (!yy__(G))  goto l41;

  }
  l42:;	  yyprintf((stderr, "  ok   literal"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l41:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "literal"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}